

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_protozero::const_fixed_iterator<unsigned_long>_&,_const_protozero::const_fixed_iterator<unsigned_long>_&>
* __thiscall
Catch::ExprLhs<protozero::const_fixed_iterator<unsigned_long>const&>::operator!=
          (BinaryExpr<const_protozero::const_fixed_iterator<unsigned_long>_&,_const_protozero::const_fixed_iterator<unsigned_long>_&>
           *__return_storage_ptr__,
          ExprLhs<protozero::const_fixed_iterator<unsigned_long>const&> *this,
          const_fixed_iterator<unsigned_long> *rhs)

{
  const_fixed_iterator<unsigned_long> *lhs;
  bool comparisonResult;
  StringRef local_30;
  const_fixed_iterator<unsigned_long> *local_20;
  const_fixed_iterator<unsigned_long> *rhs_local;
  ExprLhs<const_protozero::const_fixed_iterator<unsigned_long>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (const_fixed_iterator<unsigned_long> *)this;
  this_local = (ExprLhs<const_protozero::const_fixed_iterator<unsigned_long>_&> *)
               __return_storage_ptr__;
  comparisonResult =
       compareNotEqual<protozero::const_fixed_iterator<unsigned_long>,protozero::const_fixed_iterator<unsigned_long>const&>
                 (*(const_fixed_iterator<unsigned_long> **)this,rhs);
  lhs = *(const_fixed_iterator<unsigned_long> **)this;
  StringRef::StringRef(&local_30,"!=");
  BinaryExpr<const_protozero::const_fixed_iterator<unsigned_long>_&,_const_protozero::const_fixed_iterator<unsigned_long>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }